

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::
either<toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>
::invoke<std::__cxx11::string>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          either<toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>
          *this,location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *loc)

{
  bool bVar1;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_00
  ;
  undefined1 local_68 [8];
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *loc_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)this;
  character<(char)92>::invoke<std::__cxx11::string>
            ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              *)local_68,(character<(char)92> *)this,loc);
  bVar1 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
          ::is_ok((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                   *)local_68);
  if (bVar1) {
    result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
    ::result(__return_storage_ptr__,
             (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              *)local_68);
  }
  else {
    either<toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>
    ::invoke<std::__cxx11::string>
              (__return_storage_ptr__,
               (either<toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>
                *)rslt.field_1.succ.value.last_._M_current,loc_00);
  }
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  ::~result((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
             *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }